

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

bool cfd::core::ScriptOperator::IsValid(string *message)

{
  size_t __n;
  uint __val;
  uint uVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  iterator iVar5;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  uint __len;
  bool bVar9;
  string opcode_text;
  string __str;
  long *local_70;
  size_t local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar9 = false;
  if ((message->_M_string_length != 0) &&
     (bVar9 = false, g_operator_text_map_abi_cxx11_._40_8_ != 0)) {
    iVar2 = ::std::__cxx11::string::compare((char *)message);
    bVar9 = true;
    if ((iVar2 != 0) && (iVar2 = ::std::__cxx11::string::compare((char *)message), iVar2 != 0)) {
      if (3 < message->_M_string_length) {
        ::std::__cxx11::string::substr((ulong)&local_70,(ulong)message);
        uVar3 = atoi((char *)local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        __val = -uVar3;
        if (0 < (int)uVar3) {
          __val = uVar3;
        }
        __len = 1;
        if (9 < __val) {
          uVar8 = (ulong)__val;
          uVar1 = 4;
          do {
            __len = uVar1;
            uVar6 = (uint)uVar8;
            if (uVar6 < 100) {
              __len = __len - 2;
              goto LAB_00312744;
            }
            if (uVar6 < 1000) {
              __len = __len - 1;
              goto LAB_00312744;
            }
            if (uVar6 < 10000) goto LAB_00312744;
            uVar8 = uVar8 / 10000;
            uVar1 = __len + 4;
          } while (99999 < uVar6);
          __len = __len + 1;
        }
LAB_00312744:
        local_50[0] = local_40;
        ::std::__cxx11::string::_M_construct
                  ((ulong)local_50,(char)__len - (char)((int)uVar3 >> 0x1f));
        ::std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar3 >> 0x1f),__len,__val)
        ;
        plVar4 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x5e66ea);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_60 = *plVar7;
          lStack_58 = plVar4[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar7;
          local_70 = (long *)*plVar4;
        }
        local_68 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        __n = message->_M_string_length;
        bVar9 = true;
        if (__n == local_68) {
          if (__n == 0) {
            bVar9 = false;
          }
          else {
            iVar2 = bcmp((message->_M_dataplus)._M_p,local_70,__n);
            bVar9 = iVar2 != 0;
          }
        }
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (!(bool)(uVar3 - 0x11 < 0xfffffff0 | bVar9)) {
          return true;
        }
      }
      iVar5 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
                      *)g_operator_text_map_abi_cxx11_,message);
      bVar9 = iVar5._M_node != (_Base_ptr)(g_operator_text_map_abi_cxx11_ + 8);
    }
  }
  return bVar9;
}

Assistant:

bool ScriptOperator::IsValid(const std::string& message) {
  if (message.empty()) return false;
  if (g_operator_text_map.empty()) return false;
  if ((message == "OP_0") || (message == "OP_1NEGATE")) {
    return true;
  } else if (message.length() >= 4) {
    int num = std::atoi(message.substr(3).c_str());
    std::string opcode_text = "OP_" + std::to_string(num);
    if ((message == opcode_text) && (num >= 1) && (num <= 16)) {
      return true;
    }
  }
  return (g_operator_text_map.find(message) != g_operator_text_map.end());
}